

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modm-donna-64bit.h
# Opt level: O0

void expand256_modm(bignum256modm_element_t *out,uchar *in,size_t len)

{
  uint64_t uVar1;
  ulong local_118;
  bignum256modm q1;
  bignum256modm_element_t x [16];
  uchar work [64];
  size_t len_local;
  uchar *in_local;
  bignum256modm_element_t *out_local;
  
  memset(x + 0xf,0,0x40);
  memcpy(x + 0xf,in,len);
  uVar1 = U8TO64_LE((uchar *)(x + 0xf));
  x[0] = U8TO64_LE(work);
  x[1] = U8TO64_LE(work + 8);
  x[2] = U8TO64_LE(work + 0x10);
  x[3] = U8TO64_LE(work + 0x18);
  x[4] = U8TO64_LE(work + 0x20);
  x[5] = U8TO64_LE(work + 0x28);
  x[6] = U8TO64_LE(work + 0x30);
  *out = uVar1 & 0xffffffffffffff;
  out[1] = uVar1 >> 0x38 | (x[0] & 0xffffffffffff) << 8;
  out[2] = x[0] >> 0x30 | (x[1] & 0xffffffffff) << 0x10;
  out[3] = x[1] >> 0x28 | (x[2] & 0xffffffff) << 0x18;
  out[4] = x[2] >> 0x20 | (x[3] & 0xff) << 0x20;
  if (0x1f < len) {
    local_118 = x[2] >> 0x38 | (x[3] & 0xffffffffffff) << 8;
    q1[0] = x[3] >> 0x30 | (x[4] & 0xffffffffff) << 0x10;
    q1[1] = x[4] >> 0x28 | (x[5] & 0xffffffff) << 0x18;
    q1[2] = x[5] >> 0x20 | (x[6] & 0xffffff) << 0x20;
    q1[3] = x[6] >> 0x18;
    barrett_reduce256_modm(out,&local_118,out);
  }
  return;
}

Assistant:

static void
expand256_modm(bignum256modm out, const unsigned char *in, size_t len) {
	unsigned char work[64] = {0};
	bignum256modm_element_t x[16];
	bignum256modm q1;

	memcpy(work, in, len);
	x[0] = U8TO64_LE(work +  0);
	x[1] = U8TO64_LE(work +  8);
	x[2] = U8TO64_LE(work + 16);
	x[3] = U8TO64_LE(work + 24);
	x[4] = U8TO64_LE(work + 32);
	x[5] = U8TO64_LE(work + 40);
	x[6] = U8TO64_LE(work + 48);
	x[7] = U8TO64_LE(work + 56);

	/* r1 = (x mod 256^(32+1)) = x mod (2^8)(31+1) = x & ((1 << 264) - 1) */
	out[0] = (                         x[0]) & 0xffffffffffffff;
	out[1] = ((x[ 0] >> 56) | (x[ 1] <<  8)) & 0xffffffffffffff;
	out[2] = ((x[ 1] >> 48) | (x[ 2] << 16)) & 0xffffffffffffff;
	out[3] = ((x[ 2] >> 40) | (x[ 3] << 24)) & 0xffffffffffffff;
	out[4] = ((x[ 3] >> 32) | (x[ 4] << 32)) & 0x0000ffffffffff;

	/* under 252 bits, no need to reduce */
	if (len < 32)
		return;

	/* q1 = x >> 248 = 264 bits */
	q1[0] = ((x[ 3] >> 56) | (x[ 4] <<  8)) & 0xffffffffffffff;
	q1[1] = ((x[ 4] >> 48) | (x[ 5] << 16)) & 0xffffffffffffff;
	q1[2] = ((x[ 5] >> 40) | (x[ 6] << 24)) & 0xffffffffffffff;
	q1[3] = ((x[ 6] >> 32) | (x[ 7] << 32)) & 0xffffffffffffff;
	q1[4] = ((x[ 7] >> 24)                );

	barrett_reduce256_modm(out, q1, out);
}